

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

void __thiscall NNTreeImpl::repair(NNTreeImpl *this)

{
  QPDFObjectHandle *this_00;
  undefined8 uVar1;
  bool bVar2;
  string *psVar3;
  reference pTVar4;
  QPDFObjectHandle new_node;
  iterator __begin1;
  iterator __end1;
  NNTreeImpl repl;
  allocator<char> local_1ca;
  allocator<char> local_1c9;
  undefined1 local_1c8 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1a0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_190;
  iterator local_180;
  NNTreeIterator local_120;
  NNTreeImpl local_c0;
  iterator local_90;
  
  QPDFObjectHandle::newDictionary();
  local_1c8._16_8_ = this;
  psVar3 = (string *)(*(code *)**(undefined8 **)this->details)();
  QPDFObjectHandle::newArray();
  QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_1c8,psVar3,(QPDFObjectHandle *)&local_180);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_180.impl);
  uVar1 = local_1c8._16_8_;
  NNTreeImpl(&local_c0,*(NNTreeDetails **)local_1c8._16_8_,*(QPDF **)(local_1c8._16_8_ + 8),
             (QPDFObjectHandle *)local_1c8,false);
  begin(&local_180,(NNTreeImpl *)uVar1);
  local_120.path.
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_120.path;
  local_120._vptr_NNTreeIterator = (_func_int **)&PTR__NNTreeIterator_002ac0e8;
  local_120.impl = (NNTreeImpl *)uVar1;
  local_120.node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_120.path.
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node._M_size = 0;
  local_120.node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_120.item_number = -1;
  local_120.ivalue.first.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_120.ivalue.first.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_120.ivalue.second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_120.ivalue.second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_120.path.
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node.super__List_node_base._M_prev =
       local_120.path.
       super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  while( true ) {
    bVar2 = NNTreeIterator::operator!=(&local_180,&local_120);
    if (!bVar2) break;
    pTVar4 = NNTreeIterator::operator*(&local_180);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_190,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pTVar4);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1a0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&pTVar4->second);
    insert(&local_90,&local_c0,(QPDFObjectHandle *)&local_190,(QPDFObjectHandle *)&local_1a0);
    NNTreeIterator::~NNTreeIterator(&local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a0._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190._M_refcount);
    NNTreeIterator::operator++(&local_180);
  }
  NNTreeIterator::~NNTreeIterator(&local_120);
  NNTreeIterator::~NNTreeIterator(&local_180);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"/Kids",&local_1c9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"/Kids",&local_1ca);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_1c8 + 0x18),(string *)local_1c8);
  uVar1 = local_1c8._16_8_;
  this_00 = (QPDFObjectHandle *)(local_1c8._16_8_ + 0x18);
  QPDFObjectHandle::replaceKey(this_00,(string *)&local_180,(QPDFObjectHandle *)(local_1c8 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_180);
  psVar3 = (string *)(**(code **)**(undefined8 **)uVar1)();
  (**(code **)**(undefined8 **)uVar1)();
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_180,(string *)local_1c8);
  QPDFObjectHandle::replaceKey(this_00,psVar3,(QPDFObjectHandle *)&local_180);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_180.impl);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c0.oh.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c8 + 8));
  return;
}

Assistant:

void
NNTreeImpl::repair()
{
    auto new_node = QPDFObjectHandle::newDictionary();
    new_node.replaceKey(details.itemsKey(), QPDFObjectHandle::newArray());
    NNTreeImpl repl(details, qpdf, new_node, false);
    for (auto const& i: *this) {
        repl.insert(i.first, i.second);
    }
    this->oh.replaceKey("/Kids", new_node.getKey("/Kids"));
    this->oh.replaceKey(details.itemsKey(), new_node.getKey(details.itemsKey()));
}